

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O2

void idx2::CompressBufZstd(buffer *Input,bitstream *Output)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  buffer local_48;
  
  if (Input->Bytes != 0) {
    sVar2 = ZSTD_compressBound(Input->Bytes);
    lVar1 = (Output->Stream).Bytes;
    for (lVar3 = lVar1; lVar3 <= (long)(sVar2 + 8); lVar3 = (lVar3 * 3) / 2 + 8) {
    }
    if ((lVar1 < lVar3) && (lVar1 < lVar3 + 8)) {
      Mallocator();
      local_48.Data = (byte *)0x0;
      local_48.Bytes = 0;
      local_48.Alloc = &Mallocator::Instance.super_allocator;
      AllocBuf(&local_48,lVar3 + 8,(Output->Stream).Alloc);
      MemCopy(&Output->Stream,&local_48,
              (u64)(Output->BitPtr +
                   ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data)));
      Output->BitPtr = local_48.Data + ((long)Output->BitPtr - (long)(Output->Stream).Data);
      DeallocBuf(&Output->Stream);
      (Output->Stream).Alloc = local_48.Alloc;
      (Output->Stream).Data = local_48.Data;
      (Output->Stream).Bytes = local_48.Bytes;
    }
    sVar2 = ZSTD_compress((Output->Stream).Data,sVar2,Input->Data,Input->Bytes,1);
    if (sVar2 == 0) {
      fwrite("CompressBufZstd failed\n",0x17,1,_stderr);
      exit(1);
    }
    Output->BitPtr = (Output->Stream).Data + sVar2;
  }
  return;
}

Assistant:

void
CompressBufZstd(const buffer& Input, bitstream* Output)
{
  if (Size(Input) == 0)
    return;
  size_t const MaxDstSize = ZSTD_compressBound(Size(Input));
  GrowToAccomodate(Output, MaxDstSize - Size(*Output));
  size_t const CpresSize =
    ZSTD_compress(Output->Stream.Data, MaxDstSize, Input.Data, Size(Input), 1);
  if (CpresSize <= 0)
  {
    fprintf(stderr, "CompressBufZstd failed\n");
    exit(1);
  }
  Output->BitPtr = CpresSize + Output->Stream.Data;
}